

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADIOSTypes.cpp
# Opt level: O0

string * adios2::ToString_abi_cxx11_(TimeUnit value)

{
  undefined4 in_ESI;
  string *in_RDI;
  allocator local_21;
  allocator local_20;
  allocator local_1f;
  allocator local_1e;
  allocator local_1d [16];
  allocator local_d [13];
  
  switch(in_ESI) {
  case 0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"TimeUnit::Microseconds",local_d);
    std::allocator<char>::~allocator((allocator<char> *)local_d);
    break;
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"TimeUnit::Milliseconds",local_1d);
    std::allocator<char>::~allocator((allocator<char> *)local_1d);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"TimeUnit::Seconds",&local_1e);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"TimeUnit::Minutes",&local_1f);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"TimeUnit::Hours",&local_20);
    std::allocator<char>::~allocator((allocator<char> *)&local_20);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"ToString: Unknown TimeUnit",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  return in_RDI;
}

Assistant:

std::string ToString(TimeUnit value)
{
    switch (value)
    {
    case TimeUnit::Microseconds:
        return "TimeUnit::Microseconds";
    case TimeUnit::Milliseconds:
        return "TimeUnit::Milliseconds";
    case TimeUnit::Seconds:
        return "TimeUnit::Seconds";
    case TimeUnit::Minutes:
        return "TimeUnit::Minutes";
    case TimeUnit::Hours:
        return "TimeUnit::Hours";
    default:
        return "ToString: Unknown TimeUnit";
    }
}